

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O2

void __thiscall logUnits_negbase10_Test::logUnits_negbase10_Test(logUnits_negbase10_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001a6570;
  return;
}

Assistant:

TEST(logUnits, negbase10)
{
    EXPECT_EQ(convert(precise::ten, precise::log::neglog10), -1.0);
    EXPECT_EQ(convert(precise::kilo, precise::log::neglog10), -3.0);
    EXPECT_EQ(convert(precise::milli, precise::log::neglog10), 3.0);
    EXPECT_EQ(convert(precise::exa, precise::log::neglog10), -18.0);
    EXPECT_EQ(convert(precise::femto, precise::log::neglog10), 15.0);
    EXPECT_EQ(convert(-1.0, precise::log::neglog10, precise::ten), 1.0);
    EXPECT_EQ(convert(-3.0, precise::log::neglog10, precise::kilo), 1.0);
    EXPECT_DOUBLE_EQ(convert(3.0, precise::log::neglog10, precise::milli), 1.0);
    EXPECT_DOUBLE_EQ(convert(-18.0, precise::log::neglog10, precise::exa), 1.0);
    EXPECT_NEAR(
        convert(15.0, precise::log::neglog10, precise::femto),
        1.0,
        test::precise_tolerance);
}